

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,ITestCase *testCase,string *className,string *name,string *description
          ,SourceLineInfo *lineInfo)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  ulong uVar3;
  size_type sVar4;
  string *psVar5;
  int iVar6;
  const_iterator cVar7;
  bool bVar8;
  key_type local_c0;
  undefined1 local_a0;
  undefined7 uStack_9f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string *local_70;
  SourceLineInfo *local_68;
  string *local_60;
  string *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  (this->m_test).m_p = testCase;
  if (testCase != (ITestCase *)0x0) {
    (*(testCase->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(testCase);
  }
  local_78 = &(this->m_className).field_2;
  (this->m_className)._M_dataplus._M_p = (pointer)local_78;
  pcVar2 = (className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_className,pcVar2,pcVar2 + className->_M_string_length);
  local_80 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_80;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_58 = &this->m_className;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + name->_M_string_length);
  local_88 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)local_88;
  pcVar2 = (description->_M_dataplus)._M_p;
  local_60 = &this->m_name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_description,pcVar2,pcVar2 + description->_M_string_length);
  p_Var1 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = &this->m_lineInfo;
  local_90 = &(this->m_lineInfo).file.field_2;
  (this->m_lineInfo).file._M_dataplus._M_p = (pointer)local_90;
  pcVar2 = (lineInfo->file)._M_dataplus._M_p;
  local_70 = &this->m_description;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + (lineInfo->file)._M_string_length);
  (this->m_lineInfo).line = lineInfo->line;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"./","");
  sVar4 = local_c0._M_string_length;
  uVar3 = name->_M_string_length;
  if (local_c0._M_string_length <= uVar3) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
    if (local_48 == local_c0._M_string_length) {
      if (local_48 == 0) {
        bVar8 = true;
      }
      else {
        iVar6 = bcmp(local_50,local_c0._M_dataplus._M_p,local_48);
        bVar8 = iVar6 == 0;
      }
      goto LAB_00125cbd;
    }
  }
  bVar8 = false;
LAB_00125cbd:
  if ((sVar4 <= uVar3) && (local_50 != local_40)) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  psVar5 = local_70;
  this->m_isHidden = bVar8;
  local_c0._M_dataplus._M_p = (pointer)&PTR__TagExtracter_001d51b0;
  local_c0.field_2._8_8_ = 0;
  local_a0 = 0;
  local_c0._M_string_length = (size_type)&this->m_tags;
  local_c0.field_2._M_allocated_capacity = (size_type)&local_a0;
  TagParser::parse((TagParser *)&local_c0,local_70);
  std::__cxx11::string::_M_assign((string *)psVar5);
  local_c0._M_dataplus._M_p = (pointer)&PTR__TagExtracter_001d51b0;
  if ((undefined1 *)local_c0.field_2._M_allocated_capacity != &local_a0) {
    operator_delete((void *)local_c0.field_2._M_allocated_capacity,CONCAT71(uStack_9f,local_a0) + 1)
    ;
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"hide","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->m_tags)._M_t,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,(ulong)(local_c0.field_2._M_allocated_capacity + 1));
  }
  if ((_Rb_tree_header *)cVar7._M_node != p_Var1) {
    this->m_isHidden = true;
  }
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( ITestCase* testCase,
                                const std::string& className,
                                const std::string& name,
                                const std::string& description,
                                const SourceLineInfo& lineInfo )
    :   m_test( testCase ),
        m_className( className ),
        m_name( name ),
        m_description( description ),
        m_lineInfo( lineInfo ),
        m_isHidden( startsWith( name, "./" ) )
    {
        TagExtracter( m_tags ).parse( m_description );
        if( hasTag( "hide" ) )
            m_isHidden = true;
    }